

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  char *pcVar4;
  Writer *pWVar5;
  runtime_error *this;
  Error *this_00;
  uint uVar6;
  CommandLine cmdLine;
  ifstream in;
  ofstream out;
  Writer writer;
  ResultToJUnitHandler handler;
  TestLogParser parser;
  char *local_10a8;
  undefined8 local_10a0;
  char local_1098;
  undefined7 uStack_1097;
  char *local_1088;
  char *local_1080;
  char local_1078;
  undefined7 uStack_1077;
  BeginElement local_1068 [16];
  long local_e60;
  filebuf local_e58 [24];
  int aiStack_e40 [54];
  ios_base local_d68 [264];
  Writer local_c60;
  TestLogHandler local_ae0;
  Writer *local_ad8;
  TestResultParser local_ad0;
  TestLogParser local_9a8;
  BeginElement local_838 [64];
  
  local_10a8 = &local_1098;
  local_10a0 = 0;
  local_1098 = '\0';
  local_1088 = &local_1078;
  local_1080 = (char *)0x0;
  local_1078 = '\0';
  if (argc != 3) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_838[0].element._M_dataplus._M_p = (pointer)&local_838[0].element.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_838,"Expected input and output paths","");
    std::runtime_error::runtime_error(this,(string *)local_838);
    *(undefined ***)this = &PTR__runtime_error_0011b028;
    __cxa_throw(this,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = argv[1];
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&local_10a8,0,(char *)0x0,(ulong)pcVar3);
  pcVar4 = local_1080;
  pcVar3 = argv[2];
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&local_1088,0,pcVar4,(ulong)pcVar3);
  pcVar3 = local_10a8;
  std::ofstream::ofstream(&local_e60,local_1088,_S_bin);
  xe::xml::Writer::Writer(&local_c60,(ostream *)&local_e60);
  local_ae0._vptr_TestLogHandler = (_func_int **)&PTR__ResultToJUnitHandler_0011b050;
  local_ad8 = &local_c60;
  xe::TestResultParser::TestResultParser(&local_ad0);
  xe::TestLogParser::TestLogParser(&local_9a8,&local_ae0);
  if (*(int *)((long)aiStack_e40 + *(long *)(local_e60 + -0x18)) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_e60,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n",0x27);
    paVar2 = &local_838[0].element.field_2;
    local_838[0].element.field_2._M_allocated_capacity = 0x7469757374736574;
    local_838[0].element.field_2._8_2_ = 0x7365;
    local_838[0].element._M_string_length = 10;
    local_838[0].element.field_2._M_local_buf[10] = '\0';
    local_838[0].element._M_dataplus._M_p = (pointer)paVar2;
    pWVar5 = xe::xml::Writer::operator<<(&local_c60,local_838);
    paVar1 = &local_1068[0].element.field_2;
    local_1068[0].element.field_2._M_allocated_capacity = 0x7469757374736574;
    local_1068[0].element.field_2._8_2_ = 0x65;
    local_1068[0].element._M_string_length = 9;
    local_1068[0].element._M_dataplus._M_p = (pointer)paVar1;
    xe::xml::Writer::operator<<(pWVar5,local_1068);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068[0].element._M_dataplus._M_p != paVar1) {
      operator_delete(local_1068[0].element._M_dataplus._M_p,
                      local_1068[0].element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838[0].element._M_dataplus._M_p != paVar2) {
      operator_delete(local_838[0].element._M_dataplus._M_p,
                      local_838[0].element.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::ifstream(local_1068,pcVar3,_S_bin);
    do {
      std::istream::read((char *)local_1068,(long)local_838);
      uVar6 = (uint)local_1068[0].element._M_string_length;
      if (0 < (int)uVar6) {
        xe::TestLogParser::parse(&local_9a8,(deUint8 *)local_838,(ulong)(uVar6 & 0x7fffffff));
      }
    } while (0x7ff < (int)uVar6);
    std::ifstream::~ifstream(local_1068);
    pWVar5 = xe::xml::Writer::operator<<(&local_c60,(EndElementType *)&xe::xml::Writer::EndElement);
    xe::xml::Writer::operator<<(pWVar5,(EndElementType *)&xe::xml::Writer::EndElement);
    xe::TestLogParser::~TestLogParser(&local_9a8);
    local_ae0._vptr_TestLogHandler = (_func_int **)&PTR__ResultToJUnitHandler_0011b050;
    xe::TestResultParser::~TestResultParser(&local_ad0);
    xe::xml::Writer::~Writer(&local_c60);
    local_e60 = _VTT;
    *(undefined8 *)(local_e58 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_e58);
    std::ios_base::~ios_base(local_d68);
    if (local_1088 != &local_1078) {
      operator_delete(local_1088,CONCAT71(uStack_1077,local_1078) + 1);
    }
    if (local_10a8 != &local_1098) {
      operator_delete(local_10a8,CONCAT71(uStack_1097,local_1098) + 1);
    }
    return 0;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  xe::Error::Error(this_00,(char *)0x0,"out.good()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeBatchResultToJUnit.cpp"
                   ,0x8f);
  __cxa_throw(this_00,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;
	try
	{
		parseCommandLine(cmdLine, argc, argv);
	}
	catch (const std::exception&)
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		batchResultToJUnitReport(cmdLine.batchResultFile.c_str(), cmdLine.outputFile.c_str());
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}